

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O0

void __thiscall OpenMD::NPA::evolveEtaB(NPA *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long in_RDI;
  double dVar6;
  SquareMatrix3<double> *in_stack_ffffffffffffffd8;
  SquareMatrix3<double> *in_stack_ffffffffffffffe0;
  double dVar7;
  
  SquareMatrix3<double>::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x250),2,2);
  dVar7 = *pdVar5;
  dVar6 = *(double *)(in_RDI + 0x10) * *(double *)(in_RDI + 0x128);
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x1b0),2,2);
  dVar1 = *pdVar5;
  dVar2 = *(double *)(in_RDI + 0x138);
  dVar3 = *(double *)(in_RDI + 0xf8);
  dVar4 = *(double *)(in_RDI + 0x110);
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()
                     ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x208),2,2);
  *pdVar5 = dVar7 + (dVar6 * (dVar1 - dVar2 / 163882576.0)) / (dVar3 * dVar4);
  return;
}

Assistant:

void NPA::evolveEtaB() {
    prevEta = eta;
    eta(2, 2) =
        oldEta(2, 2) +
        dt2 * instaVol *
            (press(2, 2) - targetPressure / Constants::pressureConvert) /
            (NkBT * tb2);
  }